

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_socket_get_address(ENetSocket socket,ENetAddress *address)

{
  uint16_t uVar1;
  int iVar2;
  socklen_t local_38;
  undefined1 local_34 [4];
  socklen_t sinLength;
  sockaddr_in6 sin;
  ENetAddress *address_local;
  ENetSocket socket_local;
  
  local_38 = 0x1c;
  sin._20_8_ = address;
  iVar2 = getsockname(socket,(sockaddr *)local_34,&local_38);
  if (iVar2 == -1) {
    address_local._4_4_ = -1;
  }
  else {
    *(undefined8 *)sin._20_8_ = sin._0_8_;
    *(undefined8 *)(sin._20_8_ + 8) = sin.sin6_addr.__in6_u._0_8_;
    uVar1 = ntohs(local_34._2_2_);
    *(uint16_t *)(sin._20_8_ + 0x10) = uVar1;
    *(uint16_t *)(sin._20_8_ + 0x12) = sin.sin6_addr.__in6_u.__u6_addr16[4];
    address_local._4_4_ = 0;
  }
  return address_local._4_4_;
}

Assistant:

int enet_socket_get_address(ENetSocket socket, ENetAddress *address) {
        struct sockaddr_in6 sin;
        socklen_t sinLength = sizeof(struct sockaddr_in6);

        if (getsockname(socket, (struct sockaddr *) &sin, &sinLength) == -1) {
            return -1;
        }

        address->host           = sin.sin6_addr;
        address->port           = ENET_NET_TO_HOST_16(sin.sin6_port);
        address->sin6_scope_id  = sin.sin6_scope_id;

        return 0;
    }